

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
          (cmLocalUnixMakefileGenerator3 *this,ostream *cmakefileStream,cmGeneratorTarget *target)

{
  _Base_ptr __lhs;
  _Base_ptr p_Var1;
  cmMakefile *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pbVar4;
  size_type sVar5;
  bool bVar6;
  ImplicitDependLanguageMap *pIVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  char *pcVar11;
  string *psVar12;
  cmState *pcVar13;
  long lVar14;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  ImplicitDependLanguageMap *__range1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it_00;
  _Alloc_hider str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *di;
  long lVar15;
  const_iterator __first;
  string smodSep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  string binaryDir;
  string cidVar;
  NotInProjectDir local_2a0;
  cmGeneratorTarget *local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  _Base_ptr local_240;
  NotInProjectDir local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  string *local_1b8;
  _Base_ptr local_1b0;
  _Rb_tree_node_base *local_1a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  NotInProjectDir local_170;
  NotInProjectDir local_130;
  string local_f0;
  string local_d0;
  NotInProjectDir local_b0;
  NotInProjectDir local_70;
  
  local_260 = target;
  pIVar7 = GetImplicitDepends(this,target);
  std::operator<<(cmakefileStream,
                  "# The set of languages for which implicit dependencies are needed:\n");
  std::operator<<(cmakefileStream,"set(CMAKE_DEPENDS_LANGUAGES\n");
  local_240 = &(pIVar7->
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
               )._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var9 = (pIVar7->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left; p_Var9 != local_240;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    poVar8 = std::operator<<(cmakefileStream,"  \"");
    poVar8 = std::operator<<(poVar8,(string *)(p_Var9 + 1));
    std::operator<<(poVar8,"\"\n");
  }
  std::operator<<(cmakefileStream,"  )\n");
  std::operator<<(cmakefileStream,"# The set of files for implicit dependencies of each language:\n"
                 );
  p_Var9 = (pIVar7->
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b8 = &(this->super_cmLocalCommonGenerator).ConfigName;
  do {
    if (p_Var9 == local_240) {
      local_238.SourceDir._M_dataplus._M_p = (pointer)0x0;
      local_238.SourceDir._M_string_length = 0;
      local_238.SourceDir.field_2._M_allocated_capacity = 0;
      pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",
                 (allocator<char> *)&local_130);
      pcVar11 = cmMakefile::GetProperty(pcVar2,&local_2a0.SourceDir);
      std::__cxx11::string::~string((string *)&local_2a0);
      if (pcVar11 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,pcVar11,(allocator<char> *)&local_130);
        cmSystemTools::ExpandListArgument
                  (&local_2a0.SourceDir,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238,false);
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",
                 (allocator<char> *)&local_130);
      pcVar11 = cmGeneratorTarget::GetProperty(local_260,&local_2a0.SourceDir);
      std::__cxx11::string::~string((string *)&local_2a0);
      if (pcVar11 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,pcVar11,(allocator<char> *)&local_130);
        cmSystemTools::ExpandListArgument
                  (&local_2a0.SourceDir,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238,false);
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      if (local_238.SourceDir._M_dataplus._M_p != (pointer)local_238.SourceDir._M_string_length) {
        std::operator<<(cmakefileStream,"set(CMAKE_INCLUDE_TRANSFORMS\n");
        sVar5 = local_238.SourceDir._M_string_length;
        for (str._M_p = local_238.SourceDir._M_dataplus._M_p; str._M_p != (pointer)sVar5;
            str._M_p = str._M_p + 0x20) {
          poVar8 = std::operator<<(cmakefileStream,"  ");
          cmOutputConverter::EscapeForCMake(&local_2a0.SourceDir,(string *)str._M_p);
          poVar8 = std::operator<<(poVar8,(string *)&local_2a0);
          std::operator<<(poVar8,"\n");
          std::__cxx11::string::~string((string *)&local_2a0);
        }
        std::operator<<(cmakefileStream,"  )\n");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_238);
      return;
    }
    __lhs = p_Var9 + 1;
    poVar8 = std::operator<<(cmakefileStream,"set(CMAKE_DEPENDS_CHECK_");
    poVar8 = std::operator<<(poVar8,(string *)__lhs);
    std::operator<<(poVar8,"\n");
    local_1a8 = (_Rb_tree_node_base *)&p_Var9[2]._M_parent;
    local_1b0 = p_Var9;
    for (p_Var10 = p_Var9[2]._M_right; p_Var10 != local_1a8;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      p_Var1 = p_Var10[2]._M_parent;
      for (p_Var9 = *(_Base_ptr *)(p_Var10 + 2); p_Var9 != p_Var1; p_Var9 = p_Var9 + 1) {
        poVar8 = std::operator<<(cmakefileStream,"  \"");
        poVar8 = std::operator<<(poVar8,(string *)p_Var9);
        std::operator<<(poVar8,"\" ");
        poVar8 = std::operator<<(cmakefileStream,"\"");
        poVar8 = std::operator<<(poVar8,(string *)(p_Var10 + 1));
        std::operator<<(poVar8,"\"\n");
      }
    }
    std::operator<<(cmakefileStream,"  )\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CMAKE_",(allocator<char> *)&local_2a0);
    std::__cxx11::string::append((string *)&local_d0);
    std::__cxx11::string::append((char *)&local_d0);
    pcVar11 = cmMakefile::GetDefinition
                        ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                         &local_d0);
    if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
      poVar8 = std::operator<<(cmakefileStream,"set(CMAKE_");
      poVar8 = std::operator<<(poVar8,(string *)__lhs);
      poVar8 = std::operator<<(poVar8,"_COMPILER_ID \"");
      poVar8 = std::operator<<(poVar8,pcVar11);
      std::operator<<(poVar8,"\")\n");
    }
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"Fortran");
    if (bVar6) {
      pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"CMAKE_Fortran_SUBMODULE_SEP",(allocator<char> *)&local_130);
      psVar12 = cmMakefile::GetSafeDefinition(pcVar2,&local_238.SourceDir);
      std::__cxx11::string::string((string *)&local_2a0,(string *)psVar12);
      std::__cxx11::string::~string((string *)&local_238);
      pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"CMAKE_Fortran_SUBMODULE_EXT",(allocator<char> *)&local_b0);
      psVar12 = cmMakefile::GetSafeDefinition(pcVar2,&local_130.SourceDir);
      std::__cxx11::string::string((string *)&local_238,(string *)psVar12);
      std::__cxx11::string::~string((string *)&local_130);
      poVar8 = std::operator<<(cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_SEP \"");
      poVar8 = std::operator<<(poVar8,(string *)&local_2a0);
      std::operator<<(poVar8,"\")\n");
      poVar8 = std::operator<<(cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_EXT \"");
      poVar8 = std::operator<<(poVar8,(string *)&local_238);
      std::operator<<(poVar8,"\")\n");
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    local_1a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a0._M_impl.super__Rb_tree_header._M_header;
    local_1a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
    cmLocalGenerator::GetTargetDefines
              ((cmLocalGenerator *)this,local_260,local_1b8,(string *)__lhs,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1a0);
    if (local_1a0._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar8 = std::operator<<(cmakefileStream,"\n");
      poVar8 = std::operator<<(poVar8,"# Preprocessor definitions for this target.\n");
      poVar8 = std::operator<<(poVar8,"set(CMAKE_TARGET_DEFINITIONS_");
      poVar8 = std::operator<<(poVar8,(string *)__lhs);
      std::operator<<(poVar8,"\n");
      for (p_Var9 = local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &local_1a0._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        poVar8 = std::operator<<(cmakefileStream,"  ");
        cmOutputConverter::EscapeForCMake(&local_2a0.SourceDir,(string *)(p_Var9 + 1));
        poVar8 = std::operator<<(poVar8,(string *)&local_2a0);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      std::operator<<(cmakefileStream,"  )\n");
    }
    poVar8 = std::operator<<(cmakefileStream,"\n");
    std::operator<<(poVar8,"# The include file search paths:\n");
    poVar8 = std::operator<<(cmakefileStream,"set(CMAKE_");
    poVar8 = std::operator<<(poVar8,(string *)__lhs);
    std::operator<<(poVar8,"_TARGET_INCLUDE_PATH\n");
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_238);
    psVar12 = cmMakefile::GetSafeDefinition(pcVar2,&local_2a0.SourceDir);
    std::__cxx11::string::~string((string *)&local_2a0);
    cmLocalGenerator::GetIncludeDirectories
              ((cmLocalGenerator *)this,&local_258,local_260,(string *)__lhs,psVar12);
    pcVar13 = cmLocalGenerator::GetState((cmLocalGenerator *)this);
    psVar12 = cmState::GetBinaryDirectory_abi_cxx11_(pcVar13);
    std::__cxx11::string::string((string *)&local_f0,(string *)psVar12);
    pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"CMAKE_DEPENDS_IN_PROJECT_ONLY",(allocator<char> *)&local_238);
    bVar6 = cmMakefile::IsOn(pcVar2,&local_2a0.SourceDir);
    std::__cxx11::string::~string((string *)&local_2a0);
    psVar12 = local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar6) {
      pcVar13 = cmLocalGenerator::GetState((cmLocalGenerator *)this);
      psVar12 = cmState::GetSourceDirectory_abi_cxx11_(pcVar13);
      std::__cxx11::string::string((string *)&local_1d8,(string *)psVar12);
      std::__cxx11::string::string((string *)&local_1f8,(string *)&local_f0);
      local_170.BinaryDir._M_string_length = local_1f0;
      pbVar4 = local_258.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __it._M_current =
           local_258.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_170.SourceDir._M_dataplus._M_p = (pointer)&local_170.SourceDir.field_2;
      if (local_1d8 == &local_1c8) {
        local_170.SourceDir.field_2._8_8_ = local_1c8._8_8_;
      }
      else {
        local_170.SourceDir._M_dataplus._M_p = (pointer)local_1d8;
      }
      local_170.SourceDir.field_2._M_allocated_capacity._1_7_ =
           local_1c8._M_allocated_capacity._1_7_;
      local_170.SourceDir.field_2._M_local_buf[0] = local_1c8._M_local_buf[0];
      local_170.SourceDir._M_string_length = local_1d0;
      local_1d0 = 0;
      local_1c8._M_local_buf[0] = '\0';
      local_170.BinaryDir._M_dataplus._M_p = (pointer)&local_170.BinaryDir.field_2;
      if (local_1f8 == &local_1e8) {
        local_170.BinaryDir.field_2._8_8_ = local_1e8._8_8_;
      }
      else {
        local_170.BinaryDir._M_dataplus._M_p = (pointer)local_1f8;
      }
      local_170.BinaryDir.field_2._M_allocated_capacity._1_7_ =
           local_1e8._M_allocated_capacity._1_7_;
      local_170.BinaryDir.field_2._M_local_buf[0] = local_1e8._M_local_buf[0];
      local_1f0 = 0;
      local_1e8._M_local_buf[0] = '\0';
      local_1f8 = &local_1e8;
      local_1d8 = &local_1c8;
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::NotInProjectDir(&local_70,&local_170);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::NotInProjectDir(&local_b0,&local_70);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::NotInProjectDir(&local_2a0,&local_b0);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::NotInProjectDir(&local_130,&local_2a0);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::~NotInProjectDir(&local_2a0);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::NotInProjectDir(&local_238,&local_130);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::NotInProjectDir(&local_2a0,&local_238);
      lVar15 = (long)pbVar4 - (long)__it._M_current;
      for (lVar14 = lVar15 >> 7; 0 < lVar14; lVar14 = lVar14 + -1) {
        bVar6 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,__it);
        __it_00._M_current = __it._M_current;
        if (bVar6) goto LAB_0032b78f;
        bVar6 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                           __it._M_current + 1);
        __it_00._M_current = __it._M_current + 1;
        if (bVar6) goto LAB_0032b78f;
        bVar6 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                           __it._M_current + 2);
        __it_00._M_current = __it._M_current + 2;
        if (bVar6) goto LAB_0032b78f;
        bVar6 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,
                           __it._M_current + 3);
        __it_00._M_current = __it._M_current + 3;
        if (bVar6) goto LAB_0032b78f;
        __it._M_current = __it._M_current + 4;
        lVar15 = lVar15 + -0x80;
      }
      lVar15 = lVar15 >> 5;
      if (lVar15 == 1) {
LAB_0032b779:
        bVar6 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,__it);
        __it_00._M_current = __it._M_current;
        if (!bVar6) {
          __it_00._M_current = pbVar4;
        }
      }
      else if (lVar15 == 2) {
LAB_0032b764:
        bVar6 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                          ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,__it);
        __it_00._M_current = __it._M_current;
        if (!bVar6) {
          __it._M_current = __it._M_current + 1;
          goto LAB_0032b779;
        }
      }
      else {
        __it_00._M_current = pbVar4;
        if ((lVar15 == 3) &&
           (bVar6 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                              ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_2a0,__it
                              ), __it_00._M_current = __it._M_current, !bVar6)) {
          __it._M_current = __it._M_current + 1;
          goto LAB_0032b764;
        }
      }
LAB_0032b78f:
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::~NotInProjectDir(&local_2a0);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::~NotInProjectDir(&local_238);
      __first._M_current = __it_00._M_current;
      if (__it_00._M_current != pbVar4) {
        while( true ) {
          __it_00._M_current = __it_00._M_current + 1;
          if (__it_00._M_current == pbVar4) break;
          bVar6 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::NotInProjectDir>::operator()
                            ((_Iter_pred<(anonymous_namespace)::NotInProjectDir> *)&local_130,
                             __it_00);
          if (!bVar6) {
            std::__cxx11::string::operator=
                      ((string *)__first._M_current,(string *)__it_00._M_current);
            __first._M_current = __first._M_current + 1;
          }
        }
      }
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::~NotInProjectDir(&local_130);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::~NotInProjectDir(&local_b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&local_258,__first,
              (const_iterator)
              local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::~NotInProjectDir(&local_70);
      anon_unknown.dwarf_f8b1aa::NotInProjectDir::~NotInProjectDir(&local_170);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      psVar12 = local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = local_258.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; psVar12 != pbVar3; psVar12 = psVar12 + 1) {
      poVar8 = std::operator<<(cmakefileStream,"  \"");
      cmLocalGenerator::MaybeConvertToRelativePath
                (&local_2a0.SourceDir,(cmLocalGenerator *)this,&local_f0,psVar12);
      poVar8 = std::operator<<(poVar8,(string *)&local_2a0);
      std::operator<<(poVar8,"\"\n");
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    std::operator<<(cmakefileStream,"  )\n");
    std::__cxx11::string::~string((string *)&local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_258);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1a0);
    std::__cxx11::string::~string((string *)&local_d0);
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_1b0);
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo(
  std::ostream& cmakefileStream, cmGeneratorTarget* target)
{
  ImplicitDependLanguageMap const& implicitLangs =
    this->GetImplicitDepends(target);

  // list the languages
  cmakefileStream
    << "# The set of languages for which implicit dependencies are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_LANGUAGES\n";
  for (auto const& implicitLang : implicitLangs) {
    cmakefileStream << "  \"" << implicitLang.first << "\"\n";
  }
  cmakefileStream << "  )\n";

  // now list the files for each language
  cmakefileStream
    << "# The set of files for implicit dependencies of each language:\n";
  for (auto const& implicitLang : implicitLangs) {
    cmakefileStream << "set(CMAKE_DEPENDS_CHECK_" << implicitLang.first
                    << "\n";
    ImplicitDependFileMap const& implicitPairs = implicitLang.second;

    // for each file pair
    for (auto const& implicitPair : implicitPairs) {
      for (auto const& di : implicitPair.second) {
        cmakefileStream << "  \"" << di << "\" ";
        cmakefileStream << "\"" << implicitPair.first << "\"\n";
      }
    }
    cmakefileStream << "  )\n";

    // Tell the dependency scanner what compiler is used.
    std::string cidVar = "CMAKE_";
    cidVar += implicitLang.first;
    cidVar += "_COMPILER_ID";
    const char* cid = this->Makefile->GetDefinition(cidVar);
    if (cid && *cid) {
      cmakefileStream << "set(CMAKE_" << implicitLang.first
                      << "_COMPILER_ID \"" << cid << "\")\n";
    }

    if (implicitLang.first == "Fortran") {
      std::string smodSep =
        this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
      std::string smodExt =
        this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
      cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_SEP \"" << smodSep
                      << "\")\n";
      cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_EXT \"" << smodExt
                      << "\")\n";
    }

    // Build a list of preprocessor definitions for the target.
    std::set<std::string> defines;
    this->GetTargetDefines(target, this->ConfigName, implicitLang.first,
                           defines);
    if (!defines.empty()) {
      /* clang-format off */
      cmakefileStream
        << "\n"
        << "# Preprocessor definitions for this target.\n"
        << "set(CMAKE_TARGET_DEFINITIONS_" << implicitLang.first << "\n";
      /* clang-format on */
      for (std::string const& define : defines) {
        cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(define)
                        << "\n";
      }
      cmakefileStream << "  )\n";
    }

    // Target-specific include directories:
    cmakefileStream << "\n"
                    << "# The include file search paths:\n";
    cmakefileStream << "set(CMAKE_" << implicitLang.first
                    << "_TARGET_INCLUDE_PATH\n";
    std::vector<std::string> includes;

    const std::string& config =
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    this->GetIncludeDirectories(includes, target, implicitLang.first, config);
    std::string binaryDir = this->GetState()->GetBinaryDirectory();
    if (this->Makefile->IsOn("CMAKE_DEPENDS_IN_PROJECT_ONLY")) {
      std::string const& sourceDir = this->GetState()->GetSourceDirectory();
      cmEraseIf(includes, ::NotInProjectDir(sourceDir, binaryDir));
    }
    for (std::string const& include : includes) {
      cmakefileStream << "  \""
                      << this->MaybeConvertToRelativePath(binaryDir, include)
                      << "\"\n";
    }
    cmakefileStream << "  )\n";
  }

  // Store include transform rule properties.  Write the directory
  // rules first because they may be overridden by later target rules.
  std::vector<std::string> transformRules;
  if (const char* xform =
        this->Makefile->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
    cmSystemTools::ExpandListArgument(xform, transformRules);
  }
  if (const char* xform =
        target->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
    cmSystemTools::ExpandListArgument(xform, transformRules);
  }
  if (!transformRules.empty()) {
    cmakefileStream << "set(CMAKE_INCLUDE_TRANSFORMS\n";
    for (std::string const& tr : transformRules) {
      cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(tr) << "\n";
    }
    cmakefileStream << "  )\n";
  }
}